

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Swish_x86_avx::forward_inplace(Swish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [24];
  undefined1 auVar26 [16];
  long *in_RSI;
  float fVar27;
  float fVar28;
  __m128 _p_1;
  __m128 _zero;
  __m128 _one;
  __m256 _p;
  __m256 _zero_avx;
  __m256 _one_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  int local_1438;
  undefined8 local_1428;
  undefined8 local_1420;
  undefined8 local_1418;
  undefined4 local_1410;
  long local_1408;
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  undefined4 local_13f0;
  undefined8 local_13e8;
  undefined1 (*local_13e0) [32];
  int local_13d4;
  int local_13d0;
  int local_13cc;
  int local_13c8;
  int local_13c4;
  int local_13c0;
  int local_13bc;
  long *local_13b0;
  undefined1 local_139d;
  int local_139c;
  undefined8 *local_1390;
  undefined8 *local_1388;
  undefined8 *local_1378;
  undefined4 local_1364;
  undefined1 local_1360 [32];
  undefined1 (*local_1328) [32];
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined1 local_1260 [32];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [8];
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  ulong uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 (*local_1088) [32];
  undefined4 local_1080;
  undefined4 uStack_107c;
  undefined4 uStack_1078;
  undefined4 uStack_1074;
  undefined4 local_1064;
  undefined1 local_1060 [16];
  undefined1 (*local_1048) [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  undefined8 local_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  float local_ff0;
  float fStack_fec;
  float fStack_fe8;
  float fStack_fe4;
  undefined1 local_fe0 [16];
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [16];
  undefined1 local_fb0 [8];
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined1 local_f90 [16];
  undefined1 local_f80 [16];
  undefined8 local_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 local_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 local_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  ulong uStack_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined1 (*local_ed8) [32];
  long local_ed0;
  undefined4 local_ec4;
  long local_ec0;
  undefined1 (*local_eb8) [32];
  undefined4 local_eac;
  int local_ea8;
  int local_ea4;
  undefined8 *local_ea0;
  undefined4 local_e94;
  long local_e90;
  undefined8 *local_e70;
  undefined1 local_e40 [16];
  undefined1 auStack_e30 [16];
  undefined4 local_e20;
  undefined4 local_e1c;
  undefined4 local_e18;
  undefined4 local_e14;
  undefined4 local_e10;
  undefined4 local_e0c;
  undefined4 local_e08;
  undefined4 local_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined1 *local_d78;
  undefined8 *local_d70;
  float *local_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  float *local_d18;
  undefined1 *local_d10;
  float *local_d08;
  float local_d00 [2];
  float afStack_cf8 [2];
  float afStack_cf0 [2];
  float afStack_ce8 [2];
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  float *local_cb8;
  undefined1 *local_cb0;
  float *local_ca8;
  float local_ca0 [2];
  float afStack_c98 [2];
  float afStack_c90 [2];
  float afStack_c88 [2];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  float *local_c58;
  undefined1 *local_c50;
  float *local_c48;
  float local_c40 [2];
  float afStack_c38 [2];
  float afStack_c30 [2];
  float afStack_c28 [2];
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  float *local_bf8;
  undefined1 *local_bf0;
  float *local_be8;
  float local_be0 [2];
  float afStack_bd8 [2];
  float afStack_bd0 [2];
  float afStack_bc8 [2];
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  float *local_b98;
  undefined1 *local_b90;
  float *local_b88;
  float local_b80 [2];
  float afStack_b78 [2];
  float afStack_b70 [2];
  float afStack_b68 [2];
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float *local_b38;
  float *local_b30;
  undefined1 *local_b28;
  float local_b20 [2];
  float afStack_b18 [2];
  float afStack_b10 [2];
  float afStack_b08 [2];
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined4 uStack_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 *local_a98;
  float *local_a90;
  undefined1 *local_a88;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined1 *local_a38;
  float *local_a30;
  undefined1 *local_a28;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0 [2];
  float afStack_9d8 [2];
  float afStack_9d0 [2];
  float afStack_9c8 [2];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0 [2];
  float afStack_998 [2];
  float afStack_990 [2];
  float afStack_988 [2];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960 [2];
  float afStack_958 [2];
  float afStack_950 [2];
  float afStack_948 [2];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_780 [32];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined4 local_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined4 local_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined4 local_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined4 local_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 *local_338;
  float *local_330;
  undefined1 *local_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2d8;
  float *local_2d0;
  undefined1 *local_2c8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 *local_278;
  undefined8 *local_270;
  float *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  float *local_218;
  undefined1 *local_210;
  float *local_208;
  float local_200 [2];
  float afStack_1f8 [2];
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float *local_1b8;
  undefined1 *local_1b0;
  float *local_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  float *local_158;
  undefined1 *local_150;
  float *local_148;
  float local_140 [2];
  float afStack_138 [2];
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  float *local_f8;
  undefined1 *local_f0;
  float *local_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  float *local_98;
  undefined1 *local_90;
  float *local_88;
  float local_80 [2];
  float afStack_78 [2];
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_13bc = *(int *)((long)in_RSI + 0x2c);
  local_13c0 = (int)in_RSI[6];
  local_13c4 = *(int *)((long)in_RSI + 0x34);
  local_13c8 = (int)in_RSI[7];
  local_13cc = (int)in_RSI[3];
  local_13d0 = local_13bc * local_13c0 * local_13c4 * local_13cc;
  local_13b0 = in_RSI;
  for (local_13d4 = 0; local_13d4 < local_13c8; local_13d4 = local_13d4 + 1) {
    local_1390 = &local_1428;
    local_ea4 = *(int *)((long)local_13b0 + 0x2c);
    local_ea8 = (int)local_13b0[6];
    local_eac = *(undefined4 *)((long)local_13b0 + 0x34);
    local_eb8 = (undefined1 (*) [32])
                (*local_13b0 + local_13b0[8] * (long)local_13d4 * local_13b0[2]);
    local_ec0 = local_13b0[2];
    local_ec4 = (undefined4)local_13b0[3];
    local_ed0 = local_13b0[4];
    local_ea0 = &local_1428;
    local_e90 = (long)local_ea4 * (long)local_ea8 * local_ec0;
    local_1388 = &local_1428;
    local_1378 = &local_1428;
    local_e94 = 0x10;
    local_139c = local_13d4;
    local_139d = 1;
    local_1428 = 0;
    local_1418 = 0;
    local_1410 = 0;
    local_1400 = 0;
    local_13fc = 0;
    local_13f8 = 0;
    local_13f4 = 0;
    local_13f0 = 0;
    local_13e8 = 0;
    local_1420 = 0;
    local_1438 = 0;
    local_1364 = 0x3f800000;
    local_e04 = 0x3f800000;
    local_e08 = 0x3f800000;
    local_e0c = 0x3f800000;
    local_e10 = 0x3f800000;
    local_e14 = 0x3f800000;
    local_e18 = 0x3f800000;
    local_e1c = 0x3f800000;
    local_e20 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_e40 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_e30 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_1360._8_8_ = SUB328(ZEXT832(0),4);
    local_13e0 = local_eb8;
    for (; local_1438 + 7 < local_13d0; local_1438 = local_1438 + 8) {
      local_1328 = local_13e0;
      auVar25 = *(undefined1 (*) [24])*local_13e0;
      uStack_12e8 = *(undefined8 *)(*local_13e0 + 0x18);
      local_14a0 = auVar25._0_8_;
      local_1300 = local_14a0;
      uStack_1498 = auVar25._8_8_;
      uStack_12f8 = uStack_1498;
      uStack_1490 = auVar25._16_8_;
      uStack_12f0 = uStack_1490;
      local_10e0 = 0;
      uStack_10d8 = local_1360._8_8_;
      uStack_10d0 = 0;
      uStack_10c8 = 0;
      auVar6 = vsubps_avx(ZEXT832((ulong)local_1360._8_8_) << 0x40,*local_13e0);
      local_11a0 = ZEXT832(0) << 0x20;
      local_1240 = 0x3f8000003f800000;
      uStack_1238 = 0x3f8000003f800000;
      uStack_1230 = 0x3f8000003f800000;
      uStack_1228 = 0x3f8000003f800000;
      local_11c0._0_8_ = auVar6._0_8_;
      local_de0 = local_11c0._0_8_;
      local_11c0._8_8_ = auVar6._8_8_;
      uStack_dd8 = local_11c0._8_8_;
      local_11c0._16_8_ = auVar6._16_8_;
      uStack_dd0 = local_11c0._16_8_;
      local_11c0._24_8_ = auVar6._24_8_;
      uStack_dc8 = local_11c0._24_8_;
      local_e00 = 0x42b0c0a542b0c0a5;
      uStack_df8 = 0x42b0c0a542b0c0a5;
      uStack_df0 = 0x42b0c0a542b0c0a5;
      uStack_de8 = 0x42b0c0a542b0c0a5;
      auVar4._8_8_ = 0x42b0c0a542b0c0a5;
      auVar4._0_8_ = 0x42b0c0a542b0c0a5;
      auVar4._16_8_ = 0x42b0c0a542b0c0a5;
      auVar4._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar4);
      local_11c0._0_8_ = auVar6._0_8_;
      local_da0 = local_11c0._0_8_;
      local_11c0._8_8_ = auVar6._8_8_;
      uStack_d98 = local_11c0._8_8_;
      local_11c0._16_8_ = auVar6._16_8_;
      uStack_d90 = local_11c0._16_8_;
      local_11c0._24_8_ = auVar6._24_8_;
      uStack_d88 = local_11c0._24_8_;
      local_dc0 = 0xc2b0c0a5c2b0c0a5;
      uStack_db8 = 0xc2b0c0a5c2b0c0a5;
      uStack_db0 = 0xc2b0c0a5c2b0c0a5;
      uStack_da8 = 0xc2b0c0a5c2b0c0a5;
      auVar5._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar6,auVar5);
      local_d78 = local_11c0;
      local_b30 = ::_ps256_cephes_LOG2EF;
      local_b38 = ::_ps256_0p5;
      local_11c0._0_8_ = auVar4._0_8_;
      uVar7 = local_11c0._0_8_;
      local_11c0._8_8_ = auVar4._8_8_;
      uVar8 = local_11c0._8_8_;
      local_11c0._16_8_ = auVar4._16_8_;
      uVar9 = local_11c0._16_8_;
      local_11c0._24_8_ = auVar4._24_8_;
      uVar10 = local_11c0._24_8_;
      local_960[0] = 1.442695;
      local_960[1] = 1.442695;
      afStack_958[0] = 1.442695;
      afStack_958[1] = 1.442695;
      afStack_950[0] = 1.442695;
      afStack_950[1] = 1.442695;
      afStack_948[0] = 1.442695;
      afStack_948[1] = 1.442695;
      local_940._0_4_ = auVar4._0_4_;
      local_940._4_4_ = auVar4._4_4_;
      uStack_938._0_4_ = auVar4._8_4_;
      uStack_938._4_4_ = auVar4._12_4_;
      uStack_930._0_4_ = auVar4._16_4_;
      uStack_930._4_4_ = auVar4._20_4_;
      uStack_928._0_4_ = auVar4._24_4_;
      uStack_ae4 = 0x3fb8aa3b;
      local_b00 = (float)local_940 * 1.442695;
      fStack_afc = local_940._4_4_ * 1.442695;
      fStack_af8 = (float)uStack_938 * 1.442695;
      fStack_af4 = uStack_938._4_4_ * 1.442695;
      fStack_af0 = (float)uStack_930 * 1.442695;
      fStack_aec = uStack_930._4_4_ * 1.442695;
      fStack_ae8 = (float)uStack_928 * 1.442695;
      local_b20[0] = 0.5;
      local_b20[1] = 0.5;
      afStack_b18[0] = 0.5;
      afStack_b18[1] = 0.5;
      afStack_b10[0] = 0.5;
      afStack_b10[1] = 0.5;
      afStack_b08[0] = 0.5;
      afStack_b08[1] = 0.5;
      local_1200._4_4_ = fStack_afc + 0.5;
      local_1200._0_4_ = local_b00 + 0.5;
      uStack_11f8._0_4_ = fStack_af8 + 0.5;
      uStack_11f8._4_4_ = fStack_af4 + 0.5;
      uStack_11f0._0_4_ = fStack_af0 + 0.5;
      uStack_11f0._4_4_ = fStack_aec + 0.5;
      uStack_11e8._0_4_ = fStack_ae8 + 0.5;
      uStack_11e8._4_4_ = 0x3ff8aa3b;
      auVar5 = vroundps_avx(_local_1200,1);
      auVar6 = vcmpps_avx(_local_1200,auVar5,1);
      local_1260._0_8_ = auVar6._0_8_;
      local_ac0 = local_1260._0_8_;
      local_1260._8_8_ = auVar6._8_8_;
      uStack_ab8 = local_1260._8_8_;
      local_1260._16_8_ = auVar6._16_8_;
      uStack_ab0 = local_1260._16_8_;
      local_1260._24_8_ = auVar6._24_8_;
      uStack_aa8 = local_1260._24_8_;
      local_ae0 = 0x3f8000003f800000;
      uStack_ad8 = 0x3f8000003f800000;
      uStack_ad0 = 0x3f8000003f800000;
      uStack_ac8 = 0x3f8000003f800000;
      auVar12._8_8_ = 0x3f8000003f800000;
      auVar12._0_8_ = 0x3f8000003f800000;
      auVar12._16_8_ = 0x3f8000003f800000;
      auVar12._24_8_ = 0x3f8000003f800000;
      local_1260 = vandps_avx(auVar6,auVar12);
      local_11e0 = auVar5._0_8_;
      local_1120 = local_11e0;
      uStack_11d8 = auVar5._8_8_;
      uStack_1118 = uStack_11d8;
      uStack_11d0 = auVar5._16_8_;
      uStack_1110 = uStack_11d0;
      uStack_11c8 = auVar5._24_8_;
      uStack_1108 = uStack_11c8;
      local_1140 = local_1260._0_8_;
      uStack_1138 = local_1260._8_8_;
      uStack_1130 = local_1260._16_8_;
      uStack_1128 = local_1260._24_8_;
      _local_1200 = vsubps_avx(auVar5,local_1260);
      local_a88 = local_1200;
      local_a30 = ::_ps256_cephes_exp_C1;
      local_a00 = local_11c0._0_8_;
      uStack_9f8 = local_11c0._8_8_;
      uStack_9f0 = local_11c0._16_8_;
      uStack_9e8 = local_11c0._24_8_;
      local_9e0[0] = 0.6933594;
      local_9e0[1] = 0.6933594;
      afStack_9d8[0] = 0.6933594;
      afStack_9d8[1] = 0.6933594;
      afStack_9d0[0] = 0.6933594;
      afStack_9d0[1] = 0.6933594;
      afStack_9c8[0] = 0.6933594;
      afStack_9c8[1] = 0.6933594;
      local_9c0._0_4_ = local_1200._0_4_;
      local_9c0._4_4_ = local_1200._4_4_;
      uStack_9b8._0_4_ = local_1200._8_4_;
      uStack_9b8._4_4_ = local_1200._12_4_;
      uStack_9b0._0_4_ = local_1200._16_4_;
      uStack_9b0._4_4_ = local_1200._20_4_;
      uStack_9a8._0_4_ = local_1200._24_4_;
      uStack_9a8._4_4_ = local_1200._28_4_;
      fStack_a04 = uStack_9a8._4_4_;
      local_a20 = (float)local_9c0 * 0.6933594;
      fStack_a1c = local_9c0._4_4_ * 0.6933594;
      fStack_a18 = (float)uStack_9b8 * 0.6933594;
      fStack_a14 = uStack_9b8._4_4_ * 0.6933594;
      fStack_a10 = (float)uStack_9b0 * 0.6933594;
      fStack_a0c = uStack_9b0._4_4_ * 0.6933594;
      fStack_a08 = (float)uStack_9a8 * 0.6933594;
      auVar14._4_4_ = fStack_a1c;
      auVar14._0_4_ = local_a20;
      auVar14._8_4_ = fStack_a18;
      auVar14._12_4_ = fStack_a14;
      auVar14._16_4_ = fStack_a10;
      auVar14._20_4_ = fStack_a0c;
      auVar14._24_4_ = fStack_a08;
      auVar14._28_4_ = uStack_9a8._4_4_;
      auVar6 = vsubps_avx(auVar4,auVar14);
      local_a90 = ::_ps256_cephes_exp_C2;
      local_11c0._0_8_ = auVar6._0_8_;
      local_a60 = local_11c0._0_8_;
      local_11c0._8_8_ = auVar6._8_8_;
      uStack_a58 = local_11c0._8_8_;
      local_11c0._16_8_ = auVar6._16_8_;
      uStack_a50 = local_11c0._16_8_;
      local_11c0._24_8_ = auVar6._24_8_;
      uStack_a48 = local_11c0._24_8_;
      local_980 = local_1200;
      uStack_978 = uStack_11f8;
      uStack_970 = uStack_11f0;
      uStack_968 = uStack_11e8;
      local_9a0[0] = -0.00021219444;
      local_9a0[1] = -0.00021219444;
      afStack_998[0] = -0.00021219444;
      afStack_998[1] = -0.00021219444;
      afStack_990[0] = -0.00021219444;
      afStack_990[1] = -0.00021219444;
      afStack_988[0] = -0.00021219444;
      afStack_988[1] = -0.00021219444;
      fStack_a64 = uStack_9a8._4_4_;
      local_a80 = (float)local_9c0 * -0.00021219444;
      fStack_a7c = local_9c0._4_4_ * -0.00021219444;
      fStack_a78 = (float)uStack_9b8 * -0.00021219444;
      fStack_a74 = uStack_9b8._4_4_ * -0.00021219444;
      fStack_a70 = (float)uStack_9b0 * -0.00021219444;
      fStack_a6c = uStack_9b0._4_4_ * -0.00021219444;
      fStack_a68 = (float)uStack_9a8 * -0.00021219444;
      auVar13._4_4_ = fStack_a7c;
      auVar13._0_4_ = local_a80;
      auVar13._8_4_ = fStack_a78;
      auVar13._12_4_ = fStack_a74;
      auVar13._16_4_ = fStack_a70;
      auVar13._20_4_ = fStack_a6c;
      auVar13._24_4_ = fStack_a68;
      auVar13._28_4_ = uStack_9a8._4_4_;
      local_11c0 = vsubps_avx(auVar6,auVar13);
      local_760 = local_11c0._0_8_;
      uStack_758 = local_11c0._8_8_;
      uStack_750 = local_11c0._16_8_;
      uStack_748 = local_11c0._24_8_;
      local_740._0_4_ = local_11c0._0_4_;
      local_740._4_4_ = local_11c0._4_4_;
      uStack_738._0_4_ = local_11c0._8_4_;
      uStack_738._4_4_ = local_11c0._12_4_;
      uStack_730._0_4_ = local_11c0._16_4_;
      uStack_730._4_4_ = local_11c0._20_4_;
      uStack_728._0_4_ = local_11c0._24_4_;
      uStack_728._4_4_ = local_11c0._28_4_;
      local_11e0 = CONCAT44(local_740._4_4_ * local_740._4_4_,(float)local_740 * (float)local_740);
      uStack_11d8._0_4_ = (float)uStack_738 * (float)uStack_738;
      uStack_11d8._4_4_ = uStack_738._4_4_ * uStack_738._4_4_;
      uStack_11d0._0_4_ = (float)uStack_730 * (float)uStack_730;
      uStack_11d0._4_4_ = uStack_730._4_4_ * uStack_730._4_4_;
      auVar25 = _local_11e0;
      uStack_11c8._0_4_ = (float)uStack_728 * (float)uStack_728;
      uStack_11c8._4_4_ = uStack_728._4_4_;
      auVar4 = _local_11e0;
      local_d68 = &local_1280;
      local_b98 = ::_ps256_cephes_exp_p1;
      local_900 = 0x3950696739506967;
      uStack_8f8 = 0x3950696739506967;
      uStack_8f0 = 0x3950696739506967;
      uStack_8e8 = 0x3950696739506967;
      local_920 = local_11c0._0_8_;
      uStack_918 = local_11c0._8_8_;
      uStack_910 = local_11c0._16_8_;
      uStack_908 = local_11c0._24_8_;
      fStack_b44 = uStack_728._4_4_;
      local_b60 = (float)local_740 * 0.00019875691;
      fStack_b5c = local_740._4_4_ * 0.00019875691;
      fStack_b58 = (float)uStack_738 * 0.00019875691;
      fStack_b54 = uStack_738._4_4_ * 0.00019875691;
      fStack_b50 = (float)uStack_730 * 0.00019875691;
      fStack_b4c = uStack_730._4_4_ * 0.00019875691;
      fStack_b48 = (float)uStack_728 * 0.00019875691;
      local_b80[0] = 0.0013981999;
      local_b80[1] = 0.0013981999;
      afStack_b78[0] = 0.0013981999;
      afStack_b78[1] = 0.0013981999;
      afStack_b70[0] = 0.0013981999;
      afStack_b70[1] = 0.0013981999;
      afStack_b68[0] = 0.0013981999;
      afStack_b68[1] = 0.0013981999;
      local_bf8 = ::_ps256_cephes_exp_p2;
      local_8c0 = CONCAT44(fStack_b5c + 0.0013981999,local_b60 + 0.0013981999);
      uStack_8b8 = CONCAT44(fStack_b54 + 0.0013981999,fStack_b58 + 0.0013981999);
      uStack_8b0 = CONCAT44(fStack_b4c + 0.0013981999,fStack_b50 + 0.0013981999);
      uStack_8a8 = CONCAT44(uStack_728._4_4_ + 0.0013981999,fStack_b48 + 0.0013981999);
      local_8e0 = local_11c0._0_8_;
      uStack_8d8 = local_11c0._8_8_;
      uStack_8d0 = local_11c0._16_8_;
      uStack_8c8 = local_11c0._24_8_;
      fStack_ba4 = uStack_728._4_4_;
      local_bc0 = (local_b60 + 0.0013981999) * (float)local_740;
      fStack_bbc = (fStack_b5c + 0.0013981999) * local_740._4_4_;
      fStack_bb8 = (fStack_b58 + 0.0013981999) * (float)uStack_738;
      fStack_bb4 = (fStack_b54 + 0.0013981999) * uStack_738._4_4_;
      fStack_bb0 = (fStack_b50 + 0.0013981999) * (float)uStack_730;
      fStack_bac = (fStack_b4c + 0.0013981999) * uStack_730._4_4_;
      fStack_ba8 = (fStack_b48 + 0.0013981999) * (float)uStack_728;
      local_be0[0] = 0.008333452;
      local_be0[1] = 0.008333452;
      afStack_bd8[0] = 0.008333452;
      afStack_bd8[1] = 0.008333452;
      afStack_bd0[0] = 0.008333452;
      afStack_bd0[1] = 0.008333452;
      afStack_bc8[0] = 0.008333452;
      afStack_bc8[1] = 0.008333452;
      local_c58 = ::_ps256_cephes_exp_p3;
      local_880 = CONCAT44(fStack_bbc + 0.008333452,local_bc0 + 0.008333452);
      uStack_878 = CONCAT44(fStack_bb4 + 0.008333452,fStack_bb8 + 0.008333452);
      uStack_870 = CONCAT44(fStack_bac + 0.008333452,fStack_bb0 + 0.008333452);
      uStack_868 = CONCAT44(uStack_728._4_4_ + 0.008333452,fStack_ba8 + 0.008333452);
      local_8a0 = local_11c0._0_8_;
      uStack_898 = local_11c0._8_8_;
      uStack_890 = local_11c0._16_8_;
      uStack_888 = local_11c0._24_8_;
      fStack_c04 = uStack_728._4_4_;
      local_c20 = (local_bc0 + 0.008333452) * (float)local_740;
      fStack_c1c = (fStack_bbc + 0.008333452) * local_740._4_4_;
      fStack_c18 = (fStack_bb8 + 0.008333452) * (float)uStack_738;
      fStack_c14 = (fStack_bb4 + 0.008333452) * uStack_738._4_4_;
      fStack_c10 = (fStack_bb0 + 0.008333452) * (float)uStack_730;
      fStack_c0c = (fStack_bac + 0.008333452) * uStack_730._4_4_;
      fStack_c08 = (fStack_ba8 + 0.008333452) * (float)uStack_728;
      local_c40[0] = 0.041665796;
      local_c40[1] = 0.041665796;
      afStack_c38[0] = 0.041665796;
      afStack_c38[1] = 0.041665796;
      afStack_c30[0] = 0.041665796;
      afStack_c30[1] = 0.041665796;
      afStack_c28[0] = 0.041665796;
      afStack_c28[1] = 0.041665796;
      local_cb8 = ::_ps256_cephes_exp_p4;
      local_840 = CONCAT44(fStack_c1c + 0.041665796,local_c20 + 0.041665796);
      uStack_838 = CONCAT44(fStack_c14 + 0.041665796,fStack_c18 + 0.041665796);
      uStack_830 = CONCAT44(fStack_c0c + 0.041665796,fStack_c10 + 0.041665796);
      uStack_828 = CONCAT44(uStack_728._4_4_ + 0.041665796,fStack_c08 + 0.041665796);
      local_860 = local_11c0._0_8_;
      uStack_858 = local_11c0._8_8_;
      uStack_850 = local_11c0._16_8_;
      uStack_848 = local_11c0._24_8_;
      fStack_c64 = uStack_728._4_4_;
      local_c80 = (local_c20 + 0.041665796) * (float)local_740;
      fStack_c7c = (fStack_c1c + 0.041665796) * local_740._4_4_;
      fStack_c78 = (fStack_c18 + 0.041665796) * (float)uStack_738;
      fStack_c74 = (fStack_c14 + 0.041665796) * uStack_738._4_4_;
      fStack_c70 = (fStack_c10 + 0.041665796) * (float)uStack_730;
      fStack_c6c = (fStack_c0c + 0.041665796) * uStack_730._4_4_;
      fStack_c68 = (fStack_c08 + 0.041665796) * (float)uStack_728;
      local_ca0[0] = 0.16666666;
      local_ca0[1] = 0.16666666;
      afStack_c98[0] = 0.16666666;
      afStack_c98[1] = 0.16666666;
      afStack_c90[0] = 0.16666666;
      afStack_c90[1] = 0.16666666;
      afStack_c88[0] = 0.16666666;
      afStack_c88[1] = 0.16666666;
      local_d18 = ::_ps256_cephes_exp_p5;
      local_800 = CONCAT44(fStack_c7c + 0.16666666,local_c80 + 0.16666666);
      uStack_7f8 = CONCAT44(fStack_c74 + 0.16666666,fStack_c78 + 0.16666666);
      uStack_7f0 = CONCAT44(fStack_c6c + 0.16666666,fStack_c70 + 0.16666666);
      uStack_7e8 = CONCAT44(uStack_728._4_4_ + 0.16666666,fStack_c68 + 0.16666666);
      local_820 = local_11c0._0_8_;
      uStack_818 = local_11c0._8_8_;
      uStack_810 = local_11c0._16_8_;
      uStack_808 = local_11c0._24_8_;
      fStack_cc4 = uStack_728._4_4_;
      local_ce0 = (local_c80 + 0.16666666) * (float)local_740;
      fStack_cdc = (fStack_c7c + 0.16666666) * local_740._4_4_;
      fStack_cd8 = (fStack_c78 + 0.16666666) * (float)uStack_738;
      fStack_cd4 = (fStack_c74 + 0.16666666) * uStack_738._4_4_;
      fStack_cd0 = (fStack_c70 + 0.16666666) * (float)uStack_730;
      fStack_ccc = (fStack_c6c + 0.16666666) * uStack_730._4_4_;
      fStack_cc8 = (fStack_c68 + 0.16666666) * (float)uStack_728;
      local_d00[0] = 0.5;
      local_d00[1] = 0.5;
      afStack_cf8[0] = 0.5;
      afStack_cf8[1] = 0.5;
      afStack_cf0[0] = 0.5;
      afStack_cf0[1] = 0.5;
      afStack_ce8[0] = 0.5;
      afStack_ce8[1] = 0.5;
      local_d70 = &local_11e0;
      local_7c0 = CONCAT44(fStack_cdc + 0.5,local_ce0 + 0.5);
      uStack_7b8 = CONCAT44(fStack_cd4 + 0.5,fStack_cd8 + 0.5);
      uStack_7b0 = CONCAT44(fStack_ccc + 0.5,fStack_cd0 + 0.5);
      uStack_7a8 = CONCAT44(uStack_728._4_4_ + 0.5,fStack_cc8 + 0.5);
      local_7e0 = local_11e0;
      uStack_7d8 = uStack_11d8;
      uStack_11d0 = auVar25._16_8_;
      uStack_7d0 = uStack_11d0;
      uStack_11c8 = auVar4._24_8_;
      uStack_7c8 = uStack_11c8;
      fStack_d24 = uStack_728._4_4_;
      local_d40 = (local_ce0 + 0.5) * (float)local_740 * (float)local_740;
      fStack_d3c = (fStack_cdc + 0.5) * local_740._4_4_ * local_740._4_4_;
      fStack_d38 = (fStack_cd8 + 0.5) * (float)uStack_738 * (float)uStack_738;
      fStack_d34 = (fStack_cd4 + 0.5) * uStack_738._4_4_ * uStack_738._4_4_;
      fStack_d30 = (fStack_cd0 + 0.5) * (float)uStack_730 * (float)uStack_730;
      fStack_d2c = (fStack_ccc + 0.5) * uStack_730._4_4_ * uStack_730._4_4_;
      fStack_d28 = (fStack_cc8 + 0.5) * (float)uStack_728 * (float)uStack_728;
      local_d60 = local_11c0._0_8_;
      uStack_d58 = local_11c0._8_8_;
      uStack_d50 = local_11c0._16_8_;
      uStack_d48 = local_11c0._24_8_;
      local_1160 = CONCAT44(fStack_d3c + local_740._4_4_,local_d40 + (float)local_740);
      uStack_1158 = CONCAT44(fStack_d34 + uStack_738._4_4_,fStack_d38 + (float)uStack_738);
      uStack_1150 = CONCAT44(fStack_d2c + uStack_730._4_4_,fStack_d30 + (float)uStack_730);
      uStack_1148 = CONCAT44(uStack_728._4_4_ + uStack_728._4_4_,fStack_d28 + (float)uStack_728);
      local_1180 = 0x3f8000003f800000;
      uStack_1178 = 0x3f8000003f800000;
      uStack_1170 = 0x3f8000003f800000;
      uStack_1168 = 0x3f8000003f800000;
      local_1280 = local_d40 + (float)local_740 + 1.0;
      fStack_127c = fStack_d3c + local_740._4_4_ + 1.0;
      fStack_1278 = fStack_d38 + (float)uStack_738 + 1.0;
      fStack_1274 = fStack_d34 + uStack_738._4_4_ + 1.0;
      fStack_1270 = fStack_d30 + (float)uStack_730 + 1.0;
      fStack_126c = fStack_d2c + uStack_730._4_4_ + 1.0;
      fStack_1268 = fStack_d28 + (float)uStack_728 + 1.0;
      fStack_1264 = uStack_728._4_4_ + uStack_728._4_4_ + 1.0;
      local_720 = local_1200;
      uStack_718 = uStack_11f8;
      uStack_710 = uStack_11f0;
      uStack_708 = uStack_11e8;
      local_1220 = CONCAT44((int)local_9c0._4_4_,(int)(float)local_9c0);
      uStack_1218 = CONCAT44((int)uStack_9b8._4_4_,(int)(float)uStack_9b8);
      uStack_1210 = CONCAT44((int)uStack_9b0._4_4_,(int)(float)uStack_9b0);
      uStack_1208 = CONCAT44((int)uStack_9a8._4_4_,(int)(float)uStack_9a8);
      local_620 = local_1220;
      uStack_618 = uStack_1218;
      uStack_610 = uStack_1210;
      uStack_608 = uStack_1208;
      local_640 = 0x7f0000007f;
      uStack_638 = 0x7f0000007f;
      uStack_630 = 0x7f0000007f;
      uStack_628 = 0x7f0000007f;
      local_6c0 = local_1220;
      uStack_6b8 = uStack_1218;
      uStack_6b0 = uStack_1210;
      uStack_6a8 = uStack_1208;
      local_6e0 = 0x7f0000007f;
      uStack_6d8 = 0x7f0000007f;
      uStack_6d0 = 0x7f0000007f;
      uStack_6c8 = 0x7f0000007f;
      local_670 = 0x7f0000007f;
      uStack_668 = 0x7f0000007f;
      local_680 = 0x7f0000007f;
      uStack_678 = 0x7f0000007f;
      local_4e0 = local_1220;
      uStack_4d8 = uStack_1218;
      local_4f0 = 0x7f0000007f;
      uStack_4e8 = 0x7f0000007f;
      auVar15._8_8_ = uStack_1218;
      auVar15._0_8_ = local_1220;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_650 = vpaddd_avx(auVar15,auVar3);
      local_500 = uStack_1210;
      uStack_4f8 = uStack_1208;
      local_510 = 0x7f0000007f;
      uStack_508 = 0x7f0000007f;
      auVar1._8_8_ = uStack_1208;
      auVar1._0_8_ = uStack_1210;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      local_660 = vpaddd_avx(auVar1,auVar2);
      local_700 = local_650._0_8_;
      uStack_6f8 = local_650._8_8_;
      uStack_6f0 = local_660._0_8_;
      uStack_6e8 = local_660._8_8_;
      local_6a0 = local_650._0_8_;
      uStack_698 = local_650._8_8_;
      uStack_690 = local_660._0_8_;
      uStack_688 = local_660._8_8_;
      local_560 = local_650._0_8_;
      uStack_558 = local_650._8_8_;
      uStack_550 = local_660._0_8_;
      uStack_548 = local_660._8_8_;
      local_564 = 0x17;
      local_5e0 = local_650._0_8_;
      uStack_5d8 = local_650._8_8_;
      uStack_5d0 = local_660._0_8_;
      uStack_5c8 = local_660._8_8_;
      local_480 = local_650._0_8_;
      uStack_478 = local_650._8_8_;
      local_484 = 0x17;
      local_580 = vpslld_avx(local_650,ZEXT416(0x17));
      local_4a0 = local_660._0_8_;
      uStack_498 = local_660._8_8_;
      local_4a4 = 0x17;
      local_590 = vpslld_avx(local_660,ZEXT416(0x17));
      local_600 = local_580._0_8_;
      uStack_5f8 = local_580._8_8_;
      uStack_5f0 = local_590._0_8_;
      uStack_5e8 = local_590._8_8_;
      local_5c0 = local_580._0_8_;
      uStack_5b8 = local_580._8_8_;
      uStack_5b0 = local_590._0_8_;
      uStack_5a8 = local_590._8_8_;
      local_1220 = local_580._0_8_;
      uStack_1218 = local_580._8_8_;
      uStack_1210 = local_590._0_8_;
      uStack_1208 = local_590._8_8_;
      local_540 = local_580._0_8_;
      uStack_538 = local_580._8_8_;
      uStack_530 = local_590._0_8_;
      uStack_528 = local_590._8_8_;
      local_12a0 = local_580._0_8_;
      uStack_1298 = local_580._8_8_;
      uStack_1290 = local_590._0_8_;
      uStack_1288 = local_590._8_8_;
      local_780._4_4_ = fStack_127c;
      local_780._0_4_ = local_1280;
      local_780._8_4_ = fStack_1278;
      local_780._12_4_ = fStack_1274;
      local_780._16_4_ = fStack_1270;
      local_780._20_4_ = fStack_126c;
      local_780._24_4_ = fStack_1268;
      local_780._28_4_ = fStack_1264;
      local_7a0._0_4_ = local_580._0_4_;
      local_7a0._4_4_ = local_580._4_4_;
      uStack_798._0_4_ = local_580._8_4_;
      uStack_798._4_4_ = local_580._12_4_;
      uStack_790._0_4_ = local_590._0_4_;
      uStack_790._4_4_ = local_590._4_4_;
      uStack_788._0_4_ = local_590._8_4_;
      local_1280 = local_1280 * (float)local_7a0;
      fStack_127c = fStack_127c * local_7a0._4_4_;
      fStack_1278 = fStack_1278 * (float)uStack_798;
      fStack_1274 = fStack_1274 * uStack_798._4_4_;
      fStack_1270 = fStack_1270 * (float)uStack_790;
      fStack_126c = fStack_126c * uStack_790._4_4_;
      fStack_1268 = fStack_1268 * (float)uStack_788;
      local_12e0 = CONCAT44(fStack_127c,local_1280);
      uStack_12d8 = CONCAT44(fStack_1274,fStack_1278);
      uStack_12d0 = CONCAT44(fStack_126c,fStack_1270);
      uStack_12c8 = CONCAT44(fStack_1264,fStack_1268);
      local_12c0._0_4_ = local_e40._0_4_;
      local_12c0._4_4_ = local_e40._4_4_;
      uStack_12b8._0_4_ = local_e40._8_4_;
      uStack_12b8._4_4_ = local_e40._12_4_;
      uStack_12b0._0_4_ = auStack_e30._0_4_;
      uStack_12b0._4_4_ = auStack_e30._4_4_;
      uStack_12a8._0_4_ = auStack_e30._8_4_;
      uStack_12a8._4_4_ = auStack_e30._12_4_;
      local_1320 = (float)local_12c0 + local_1280;
      fStack_131c = local_12c0._4_4_ + fStack_127c;
      fStack_1318 = (float)uStack_12b8 + fStack_1278;
      fStack_1314 = uStack_12b8._4_4_ + fStack_1274;
      fStack_1310 = (float)uStack_12b0 + fStack_1270;
      fStack_130c = uStack_12b0._4_4_ + fStack_126c;
      fStack_1308 = (float)uStack_12a8 + fStack_1268;
      fStack_1304 = uStack_12a8._4_4_ + fStack_1264;
      auVar6._4_4_ = fStack_131c;
      auVar6._0_4_ = local_1320;
      auVar6._8_4_ = fStack_1318;
      auVar6._12_4_ = fStack_1314;
      auVar6._16_4_ = fStack_1310;
      auVar6._20_4_ = fStack_130c;
      auVar6._24_4_ = fStack_1308;
      auVar6._28_4_ = fStack_1304;
      auVar6 = vdivps_avx(*local_13e0,auVar6);
      local_1088 = local_13e0;
      local_14a0 = auVar6._0_8_;
      local_10c0 = local_14a0;
      uStack_1498 = auVar6._8_8_;
      uStack_10b8 = uStack_1498;
      uStack_1490 = auVar6._16_8_;
      uStack_10b0 = uStack_1490;
      uStack_1488 = auVar6._24_8_;
      uStack_10a8 = uStack_1488;
      *(undefined8 *)*local_13e0 = local_14a0;
      *(undefined8 *)(*local_13e0 + 8) = uStack_1498;
      *(undefined8 *)(*local_13e0 + 0x10) = uStack_1490;
      *(undefined8 *)(*local_13e0 + 0x18) = uStack_1488;
      local_13e0 = local_13e0 + 1;
      local_12c0 = local_e40._0_8_;
      uStack_12b8 = local_e40._8_8_;
      uStack_12b0 = auStack_e30._0_8_;
      uStack_12a8 = auStack_e30._8_8_;
      _local_11e0 = auVar4;
      local_1100 = local_1300;
      uStack_10f8 = uStack_12f8;
      uStack_10f0 = uStack_12f0;
      uStack_10e8 = uStack_12e8;
      local_d10 = local_d78;
      local_d08 = local_d68;
      local_cb0 = local_d78;
      local_ca8 = local_d68;
      local_c50 = local_d78;
      local_c48 = local_d68;
      local_bf0 = local_d78;
      local_be8 = local_d68;
      local_b90 = local_d78;
      local_b88 = local_d68;
      local_b28 = local_d78;
      local_a98 = local_d78;
      local_a38 = local_d78;
      local_a28 = local_a88;
      local_9c0 = local_1200;
      uStack_9b8 = uStack_11f8;
      uStack_9b0 = uStack_11f0;
      uStack_9a8 = uStack_11e8;
      local_940 = uVar7;
      uStack_938 = uVar8;
      uStack_930 = uVar9;
      uStack_928 = uVar10;
      local_7a0 = local_580._0_8_;
      uStack_798 = local_580._8_8_;
      uStack_790 = local_590._0_8_;
      uStack_788 = local_590._8_8_;
      local_740 = local_760;
      uStack_738 = uStack_758;
      uStack_730 = uStack_750;
      uStack_728 = uStack_748;
    }
    local_1064 = 0x3f800000;
    local_1080 = 0x3f800000;
    uStack_107c = 0x3f800000;
    uStack_1078 = 0x3f800000;
    uStack_1074 = 0x3f800000;
    local_1060._8_8_ = SUB168(ZEXT816(0),4);
    for (; local_1360 = ZEXT832(0) << 0x20, auVar2 = ZEXT816(0) << 0x20, local_e70 = local_1378,
        local_1408 = local_ed0, local_1438 + 3 < local_13d0; local_1438 = local_1438 + 4) {
      local_1048 = local_13e0;
      local_1030 = *(undefined8 *)*local_13e0;
      uStack_1028 = *(undefined8 *)(*local_13e0 + 8);
      local_f00 = 0;
      uStack_ef8 = local_1060._8_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_1060._8_8_;
      auVar2 = vsubps_avx(auVar26 << 0x40,*(undefined1 (*) [16])*local_13e0);
      local_f80 = ZEXT816(0) << 0x20;
      local_fd0 = 0x3f8000003f800000;
      uStack_fc8 = 0x3f8000003f800000;
      local_f90._0_8_ = auVar2._0_8_;
      local_440 = local_f90._0_8_;
      local_f90._8_8_ = auVar2._8_8_;
      uStack_438 = local_f90._8_8_;
      local_450 = 0x42b0c0a542b0c0a5;
      uStack_448 = 0x42b0c0a542b0c0a5;
      auVar18._8_8_ = 0x42b0c0a542b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(auVar2,auVar18);
      local_f90._0_8_ = auVar2._0_8_;
      local_420 = local_f90._0_8_;
      local_f90._8_8_ = auVar2._8_8_;
      uStack_418 = local_f90._8_8_;
      local_430 = 0xc2b0c0a5c2b0c0a5;
      uStack_428 = 0xc2b0c0a5c2b0c0a5;
      auVar19._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar19._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar2,auVar19);
      local_f90._0_8_ = auVar3._0_8_;
      uVar7 = local_f90._0_8_;
      local_f90._8_8_ = auVar3._8_8_;
      uVar8 = local_f90._8_8_;
      local_3d0 = 0x3fb8aa3b3fb8aa3b;
      uStack_3c8 = 0x3fb8aa3b3fb8aa3b;
      local_3c0._0_4_ = auVar3._0_4_;
      local_3c0._4_4_ = auVar3._4_4_;
      uStack_3b8._0_4_ = auVar3._8_4_;
      uStack_3b8._4_4_ = auVar3._12_4_;
      local_fb0._4_4_ = local_3c0._4_4_ * 1.442695;
      local_fb0._0_4_ = (float)local_3c0 * 1.442695;
      uStack_fa8._0_4_ = (float)uStack_3b8 * 1.442695;
      uStack_fa8._4_4_ = uStack_3b8._4_4_ * 1.442695;
      local_f40 = local_fb0;
      uStack_f38 = uStack_fa8;
      local_f50 = 0x3f0000003f000000;
      uStack_f48 = 0x3f0000003f000000;
      local_fb0._0_4_ = (float)local_3c0 * 1.442695 + 0.5;
      local_fb0._4_4_ = local_3c0._4_4_ * 1.442695 + 0.5;
      fVar27 = (float)uStack_3b8 * 1.442695 + 0.5;
      fVar28 = uStack_3b8._4_4_ * 1.442695 + 0.5;
      uStack_fa8._0_4_ = fVar27;
      uStack_fa8._4_4_ = fVar28;
      local_3a0 = local_fb0;
      uStack_398 = uStack_fa8;
      local_fc0._4_4_ = (int)(float)local_fb0._4_4_;
      local_fc0._0_4_ = (int)(float)local_fb0._0_4_;
      local_fc0._8_4_ = (int)fVar27;
      local_fc0._12_4_ = (int)fVar28;
      local_390 = local_fc0._0_8_;
      uStack_388 = local_fc0._8_8_;
      auVar20._8_8_ = local_fc0._8_8_;
      auVar20._0_8_ = local_fc0._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar20);
      local_fa0 = auVar1._0_8_;
      local_370 = local_fa0;
      uStack_f98 = auVar1._8_8_;
      uStack_368 = uStack_f98;
      local_380 = local_fb0;
      uStack_378 = uStack_fa8;
      auVar21._8_8_ = uStack_fa8;
      auVar21._0_8_ = local_fb0;
      auVar2 = vcmpps_avx(auVar21,auVar1,1);
      local_fe0._0_8_ = auVar2._0_8_;
      local_350 = local_fe0._0_8_;
      local_fe0._8_8_ = auVar2._8_8_;
      uStack_348 = local_fe0._8_8_;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      auVar22._8_8_ = 0x3f8000003f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      local_fe0 = vpand_avx(auVar2,auVar22);
      local_f20 = local_fa0;
      uStack_f18 = uStack_f98;
      local_f30 = local_fe0._0_8_;
      uStack_f28 = local_fe0._8_8_;
      _local_fb0 = vsubps_avx(auVar1,local_fe0);
      local_328 = local_fb0;
      local_2d0 = ::_ps_cephes_exp_C1;
      local_338 = local_f90;
      local_2b0 = local_f90._0_8_;
      uStack_2a8 = local_f90._8_8_;
      local_2a0[0] = 0.6933594;
      local_2a0[1] = 0.6933594;
      afStack_298[0] = 0.6933594;
      afStack_298[1] = 0.6933594;
      local_290._0_4_ = local_fb0._0_4_;
      local_290._4_4_ = local_fb0._4_4_;
      uStack_288._0_4_ = local_fb0._8_4_;
      uStack_288._4_4_ = local_fb0._12_4_;
      local_2c0 = (float)local_290 * 0.6933594;
      fStack_2bc = local_290._4_4_ * 0.6933594;
      fStack_2b8 = (float)uStack_288 * 0.6933594;
      fStack_2b4 = uStack_288._4_4_ * 0.6933594;
      auVar24._4_4_ = fStack_2bc;
      auVar24._0_4_ = local_2c0;
      auVar24._8_4_ = fStack_2b8;
      auVar24._12_4_ = fStack_2b4;
      auVar2 = vsubps_avx(auVar3,auVar24);
      local_330 = ::_ps_cephes_exp_C2;
      local_f90._0_8_ = auVar2._0_8_;
      local_310 = local_f90._0_8_;
      local_f90._8_8_ = auVar2._8_8_;
      uStack_308 = local_f90._8_8_;
      local_2f0 = local_fb0;
      uStack_2e8 = uStack_fa8;
      local_300[0] = -0.00021219444;
      local_300[1] = -0.00021219444;
      afStack_2f8[0] = -0.00021219444;
      afStack_2f8[1] = -0.00021219444;
      local_320 = (float)local_290 * -0.00021219444;
      fStack_31c = local_290._4_4_ * -0.00021219444;
      fStack_318 = (float)uStack_288 * -0.00021219444;
      fStack_314 = uStack_288._4_4_ * -0.00021219444;
      auVar23._4_4_ = fStack_31c;
      auVar23._0_4_ = local_320;
      auVar23._8_4_ = fStack_318;
      auVar23._12_4_ = fStack_314;
      local_f90 = vsubps_avx(auVar2,auVar23);
      local_3f0 = local_f90._0_8_;
      uStack_3e8 = local_f90._8_8_;
      local_3e0._0_4_ = local_f90._0_4_;
      local_3e0._4_4_ = local_f90._4_4_;
      uStack_3d8._0_4_ = local_f90._8_4_;
      uStack_3d8._4_4_ = local_f90._12_4_;
      local_fa0 = CONCAT44(local_3e0._4_4_ * local_3e0._4_4_,(float)local_3e0 * (float)local_3e0);
      uStack_f98._0_4_ = (float)uStack_3d8 * (float)uStack_3d8;
      uStack_f98._4_4_ = uStack_3d8._4_4_ * uStack_3d8._4_4_;
      local_268 = &local_ff0;
      local_98 = ::_ps_cephes_exp_p1;
      local_50 = 0x3950696739506967;
      uStack_48 = 0x3950696739506967;
      local_60 = local_f90._0_8_;
      uStack_58 = local_f90._8_8_;
      local_70 = (float)local_3e0 * 0.00019875691;
      fStack_6c = local_3e0._4_4_ * 0.00019875691;
      fStack_68 = (float)uStack_3d8 * 0.00019875691;
      fStack_64 = uStack_3d8._4_4_ * 0.00019875691;
      local_80[0] = 0.0013981999;
      local_80[1] = 0.0013981999;
      afStack_78[0] = 0.0013981999;
      afStack_78[1] = 0.0013981999;
      local_f8 = ::_ps_cephes_exp_p2;
      local_b0 = CONCAT44(fStack_6c + 0.0013981999,local_70 + 0.0013981999);
      uStack_a8 = CONCAT44(fStack_64 + 0.0013981999,fStack_68 + 0.0013981999);
      local_c0 = local_f90._0_8_;
      uStack_b8 = local_f90._8_8_;
      local_d0 = (local_70 + 0.0013981999) * (float)local_3e0;
      fStack_cc = (fStack_6c + 0.0013981999) * local_3e0._4_4_;
      fStack_c8 = (fStack_68 + 0.0013981999) * (float)uStack_3d8;
      fStack_c4 = (fStack_64 + 0.0013981999) * uStack_3d8._4_4_;
      local_e0[0] = 0.008333452;
      local_e0[1] = 0.008333452;
      afStack_d8[0] = 0.008333452;
      afStack_d8[1] = 0.008333452;
      local_158 = ::_ps_cephes_exp_p3;
      local_110 = CONCAT44(fStack_cc + 0.008333452,local_d0 + 0.008333452);
      uStack_108 = CONCAT44(fStack_c4 + 0.008333452,fStack_c8 + 0.008333452);
      local_120 = local_f90._0_8_;
      uStack_118 = local_f90._8_8_;
      local_130 = (local_d0 + 0.008333452) * (float)local_3e0;
      fStack_12c = (fStack_cc + 0.008333452) * local_3e0._4_4_;
      fStack_128 = (fStack_c8 + 0.008333452) * (float)uStack_3d8;
      fStack_124 = (fStack_c4 + 0.008333452) * uStack_3d8._4_4_;
      local_140[0] = 0.041665796;
      local_140[1] = 0.041665796;
      afStack_138[0] = 0.041665796;
      afStack_138[1] = 0.041665796;
      local_1b8 = ::_ps_cephes_exp_p4;
      local_170 = CONCAT44(fStack_12c + 0.041665796,local_130 + 0.041665796);
      uStack_168 = CONCAT44(fStack_124 + 0.041665796,fStack_128 + 0.041665796);
      local_180 = local_f90._0_8_;
      uStack_178 = local_f90._8_8_;
      local_190 = (local_130 + 0.041665796) * (float)local_3e0;
      fStack_18c = (fStack_12c + 0.041665796) * local_3e0._4_4_;
      fStack_188 = (fStack_128 + 0.041665796) * (float)uStack_3d8;
      fStack_184 = (fStack_124 + 0.041665796) * uStack_3d8._4_4_;
      local_1a0[0] = 0.16666666;
      local_1a0[1] = 0.16666666;
      afStack_198[0] = 0.16666666;
      afStack_198[1] = 0.16666666;
      local_218 = ::_ps_cephes_exp_p5;
      local_1d0 = CONCAT44(fStack_18c + 0.16666666,local_190 + 0.16666666);
      uStack_1c8 = CONCAT44(fStack_184 + 0.16666666,fStack_188 + 0.16666666);
      local_1e0 = local_f90._0_8_;
      uStack_1d8 = local_f90._8_8_;
      local_1f0 = (local_190 + 0.16666666) * (float)local_3e0;
      fStack_1ec = (fStack_18c + 0.16666666) * local_3e0._4_4_;
      fStack_1e8 = (fStack_188 + 0.16666666) * (float)uStack_3d8;
      fStack_1e4 = (fStack_184 + 0.16666666) * uStack_3d8._4_4_;
      local_200[0] = 0.5;
      local_200[1] = 0.5;
      afStack_1f8[0] = 0.5;
      afStack_1f8[1] = 0.5;
      local_270 = &local_fa0;
      local_230 = CONCAT44(fStack_1ec + 0.5,local_1f0 + 0.5);
      uStack_228 = CONCAT44(fStack_1e4 + 0.5,fStack_1e8 + 0.5);
      local_240 = local_fa0;
      uStack_238 = uStack_f98;
      local_250 = (local_1f0 + 0.5) * (float)local_3e0 * (float)local_3e0;
      fStack_24c = (fStack_1ec + 0.5) * local_3e0._4_4_ * local_3e0._4_4_;
      fStack_248 = (fStack_1e8 + 0.5) * (float)uStack_3d8 * (float)uStack_3d8;
      fStack_244 = (fStack_1e4 + 0.5) * uStack_3d8._4_4_ * uStack_3d8._4_4_;
      local_260 = local_f90._0_8_;
      uStack_258 = local_f90._8_8_;
      local_f60 = CONCAT44(fStack_24c + local_3e0._4_4_,local_250 + (float)local_3e0);
      uStack_f58 = CONCAT44(fStack_244 + uStack_3d8._4_4_,fStack_248 + (float)uStack_3d8);
      local_f70 = 0x3f8000003f800000;
      uStack_f68 = 0x3f8000003f800000;
      local_ff0 = local_250 + (float)local_3e0 + 1.0;
      fStack_fec = fStack_24c + local_3e0._4_4_ + 1.0;
      fStack_fe8 = fStack_248 + (float)uStack_3d8 + 1.0;
      fStack_fe4 = fStack_244 + uStack_3d8._4_4_ + 1.0;
      local_3b0 = local_fb0;
      uStack_3a8 = uStack_fa8;
      local_fc0._4_4_ = (int)local_290._4_4_;
      local_fc0._0_4_ = (int)(float)local_290;
      local_fc0._8_4_ = (int)(float)uStack_288;
      local_fc0._12_4_ = (int)uStack_288._4_4_;
      local_4c0 = local_fc0._0_8_;
      uStack_4b8 = local_fc0._8_8_;
      local_4d0 = 0x7f0000007f;
      uStack_4c8 = 0x7f0000007f;
      auVar17._8_8_ = local_fc0._8_8_;
      auVar17._0_8_ = local_fc0._0_8_;
      auVar16._8_8_ = 0x7f0000007f;
      auVar16._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar17,auVar16);
      local_fc0._0_8_ = auVar2._0_8_;
      local_460 = local_fc0._0_8_;
      local_fc0._8_8_ = auVar2._8_8_;
      uStack_458 = local_fc0._8_8_;
      local_464 = 0x17;
      local_fc0 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_40 = local_fc0._0_8_;
      uStack_38 = local_fc0._8_8_;
      local_1000 = local_fc0._0_8_;
      uStack_ff8 = local_fc0._8_8_;
      local_400._4_4_ = fStack_fec;
      local_400._0_4_ = local_ff0;
      local_400._8_4_ = fStack_fe8;
      local_400._12_4_ = fStack_fe4;
      local_410._0_4_ = local_fc0._0_4_;
      local_410._4_4_ = local_fc0._4_4_;
      uStack_408._0_4_ = local_fc0._8_4_;
      uStack_408._4_4_ = local_fc0._12_4_;
      local_ff0 = local_ff0 * (float)local_410;
      fStack_fec = fStack_fec * local_410._4_4_;
      fStack_fe8 = fStack_fe8 * (float)uStack_408;
      fStack_fe4 = fStack_fe4 * uStack_408._4_4_;
      local_1020 = CONCAT44(fStack_fec,local_ff0);
      uStack_1018 = CONCAT44(fStack_fe4,fStack_fe8);
      local_1040 = local_ff0 + 1.0;
      fStack_103c = fStack_fec + 1.0;
      fStack_1038 = fStack_fe8 + 1.0;
      fStack_1034 = fStack_fe4 + 1.0;
      auVar11._4_4_ = fStack_103c;
      auVar11._0_4_ = local_1040;
      auVar11._8_4_ = fStack_1038;
      auVar11._12_4_ = fStack_1034;
      auVar2 = vdivps_avx(*(undefined1 (*) [16])*local_13e0,auVar11);
      local_ed8 = local_13e0;
      local_14d0 = auVar2._0_8_;
      local_ef0 = local_14d0;
      uStack_14c8 = auVar2._8_8_;
      uStack_ee8 = uStack_14c8;
      *(undefined8 *)*local_13e0 = local_14d0;
      *(undefined8 *)(*local_13e0 + 8) = uStack_14c8;
      local_13e0 = (undefined1 (*) [32])(*local_13e0 + 0x10);
      local_1010 = 0x3f8000003f800000;
      uStack_1008 = 0x3f8000003f800000;
      local_f10 = local_1030;
      uStack_f08 = uStack_1028;
      local_410 = local_fc0._0_8_;
      uStack_408 = local_fc0._8_8_;
      local_3e0 = local_3f0;
      uStack_3d8 = uStack_3e8;
      local_3c0 = uVar7;
      uStack_3b8 = uVar8;
      local_2d8 = local_338;
      local_2c8 = local_328;
      local_290 = local_fb0;
      uStack_288 = uStack_fa8;
      local_278 = local_338;
      local_210 = local_338;
      local_208 = local_268;
      local_1b0 = local_338;
      local_1a8 = local_268;
      local_150 = local_338;
      local_148 = local_268;
      local_f0 = local_338;
      local_e8 = local_268;
      local_90 = local_338;
      local_88 = local_268;
    }
    for (; local_1060 = auVar2, local_1438 < local_13d0; local_1438 = local_1438 + 1) {
      fVar27 = *(float *)*local_13e0;
      fVar28 = expf(-*(float *)*local_13e0);
      *(float *)*local_13e0 = fVar27 / (fVar28 + 1.0);
      local_13e0 = (undefined1 (*) [32])(*local_13e0 + 4);
      auVar2 = local_1060;
    }
  }
  return 0;
}

Assistant:

int Swish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}